

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

VarTerm * new_var_term(Token *name,void *expr,Type *type,Modifier *modifier)

{
  Token *pTVar1;
  void *pvVar2;
  VarTerm *pVVar3;
  undefined8 *puVar4;
  
  pvVar2 = malloc(0x28);
  pVVar3 = (VarTerm *)require_not_null(pvVar2,"Failed to allocate space");
  pvVar2 = malloc(0x10);
  puVar4 = (undefined8 *)require_not_null(pvVar2,"Failed to allocate space");
  puVar4[1] = name;
  *puVar4 = var_eval;
  pTVar1 = (Token *)puVar4[1];
  (pVVar3->node).eval = (eval_handler_)*puVar4;
  (pVVar3->node).token = pTVar1;
  pVVar3->value = expr;
  pVVar3->modifier = modifier;
  pVVar3->type = type;
  return pVVar3;
}

Assistant:

VarTerm *new_var_term(Token *name, void *expr, Type* type, Modifier* modifier) {
    VarTerm *term = new(VarTerm);
    term->node = tree_node_(name, eval_handler(var_eval));
    term->value = expr;
    term->modifier = modifier;
    term->type = type;
    return term;
}